

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_8,_6>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  float *pfVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  long lVar6;
  float *pfVar7;
  bool bVar8;
  undefined4 uVar9;
  Type in1;
  Type in0;
  undefined8 uStack_90;
  float local_84 [3];
  Matrix<float,_3,_2> local_78;
  Matrix<float,_2,_3> local_58;
  int local_38 [6];
  undefined4 local_20;
  float local_1c;
  undefined4 local_18;
  float local_14;
  
  pfVar2 = (float *)&local_58;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    do {
      lVar5 = 0;
      do {
        uVar9 = 0x3f800000;
        if (lVar3 != lVar5) {
          uVar9 = 0;
        }
        pfVar2[lVar5 * 2] = (float)uVar9;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      pfVar2 = pfVar2 + 1;
      bVar8 = lVar3 == 0;
      lVar3 = lVar3 + 1;
    } while (bVar8);
    local_58.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    local_58.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    local_58.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[2].m_data;
  }
  else {
    local_58.m_data.m_data[0].m_data[0] = 0.0;
    local_58.m_data.m_data[0].m_data[1] = 0.0;
    local_58.m_data.m_data[1].m_data[0] = 0.0;
    local_58.m_data.m_data[1].m_data[1] = 0.0;
    local_58.m_data.m_data[2].m_data[0] = 0.0;
    local_58.m_data.m_data[2].m_data[1] = 0.0;
    puVar4 = &s_constInMat3x2;
    lVar3 = 0;
    do {
      lVar5 = 0;
      do {
        pfVar2[lVar5 * 2] = (float)puVar4[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      pfVar2 = pfVar2 + 1;
      puVar4 = puVar4 + 3;
      bVar8 = lVar3 == 0;
      lVar3 = lVar3 + 1;
    } while (bVar8);
  }
  pfVar2 = (float *)&local_78;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        uVar9 = 0x3f800000;
        if (lVar3 != lVar6) {
          uVar9 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar6) = uVar9;
        lVar6 = lVar6 + 0xc;
      } while (lVar6 == 0xc);
      lVar5 = lVar5 + 1;
      pfVar2 = pfVar2 + 1;
      lVar3 = lVar3 + 0xc;
    } while (lVar5 != 3);
    local_78.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_78.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    local_78.m_data.m_data[1].m_data[2] = evalCtx->in[1].m_data[2];
    local_78.m_data.m_data[1].m_data[0] = (float)uVar1;
    local_78.m_data.m_data[1].m_data[1] = (float)((ulong)uVar1 >> 0x20);
  }
  else {
    local_78.m_data.m_data[0].m_data[0] = 0.0;
    local_78.m_data.m_data[0].m_data[1] = 0.0;
    local_78.m_data.m_data[0].m_data[2] = 0.0;
    local_78.m_data.m_data[1].m_data[0] = 0.0;
    local_78.m_data.m_data[1].m_data[1] = 0.0;
    local_78.m_data.m_data[1].m_data[2] = 0.0;
    puVar4 = &DAT_00b0b998;
    lVar3 = 0;
    do {
      lVar5 = 0;
      pfVar7 = pfVar2;
      do {
        *pfVar7 = (float)puVar4[lVar5];
        lVar5 = lVar5 + 1;
        pfVar7 = pfVar7 + 3;
      } while (lVar5 == 1);
      lVar3 = lVar3 + 1;
      pfVar2 = pfVar2 + 1;
      puVar4 = puVar4 + 2;
    } while (lVar3 != 3);
  }
  uStack_90 = 0x48f72b;
  tcu::operator*((tcu *)&local_20,&local_58,&local_78);
  local_84[0] = (float)local_20;
  local_84[1] = (float)local_18;
  local_84[2] = local_1c + local_14;
  local_38[2] = 0;
  local_38[3] = 1;
  local_38[4] = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[local_38[lVar3]] = *(float *)((long)&uStack_90 + lVar3 * 4 + 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}